

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 local_50;
  undefined8 uStack_48;
  char *local_40;
  undefined8 local_38;
  long local_30;
  undefined8 uStack_28;
  undefined8 *local_20;
  StringPtr local_18;
  
  local_50 = *(undefined8 *)*param_2;
  uStack_48 = ((undefined8 *)*param_2)[1];
  local_40 = ", ";
  local_38 = 3;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = (undefined8 *)0x0;
  local_18.content.ptr = "(can\'t stringify)";
  local_18.content.size_ = 0x12;
  concat<kj::_::Delimited<kj::ArrayPtr<char16_t_const>>,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_50,
             (Delimited<kj::ArrayPtr<const_char16_t>_> *)(param_2 + 2),&local_18,param_5);
  uVar2 = uStack_28;
  lVar1 = local_30;
  if (local_30 != 0) {
    local_30 = 0;
    uStack_28 = 0;
    (**(code **)*local_20)(local_20,lVar1,0x18,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}